

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_push.c
# Opt level: O2

ssize_t mpt_connection_push(mpt_connection *con,size_t len,void *src)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ssize_t sVar6;
  mpt_stream *stream;
  uint8_t buf [64];
  
  if ((con->out).sock._id < 0) {
    stream = (mpt_stream *)(con->out).buf._buf;
    if (stream == (mpt_stream *)0x0) {
      return -1;
    }
  }
  else {
    stream = (mpt_stream *)0x0;
  }
  if ((((con->out).state & 0x10) == 0) && (bVar2 = (con->out)._idlen, bVar2 != 0)) {
    if (0x40 < bVar2) {
      return -2;
    }
    iVar3 = mpt_message_id2buf(con->cid,buf);
    if (iVar3 < 0) {
      return (long)iVar3;
    }
    uVar5 = (ulong)(con->out)._idlen;
    if (stream != (mpt_stream *)0x0) {
      uVar5 = mpt_stream_push(stream,uVar5,buf);
      if (-1 < (long)uVar5) {
        if (uVar5 < (con->out)._idlen) {
          mpt_stream_push(stream,1,(void *)0x0);
          uVar4 = con->cid;
          sVar6 = -0x11;
          goto LAB_0010572b;
        }
        puVar1 = &(con->out).state;
        *puVar1 = *puVar1 | 0x10;
      }
      goto LAB_001056b6;
    }
    sVar6 = mpt_outdata_push(&con->out,uVar5,buf);
    if (-1 < sVar6) goto LAB_001056b6;
  }
  else {
LAB_001056b6:
    if (stream == (mpt_stream *)0x0) {
      sVar6 = mpt_outdata_push(&con->out,len,src);
      if (-1 < sVar6) {
        return sVar6;
      }
      if (((con->out).state & 0x10) != 0) {
        mpt_outdata_push(&con->out,1,(void *)0x0);
      }
    }
    else {
      sVar6 = mpt_stream_push(stream,len,src);
      if (-1 < sVar6) {
        bVar2 = (con->out).state;
        if (len != 0) {
          (con->out).state = bVar2 | 0x10;
          return sVar6;
        }
        (con->out).state = bVar2 & 0xef;
        mpt_stream_flush(stream);
        con->cid = 0;
        return sVar6;
      }
      uVar4 = mpt_stream_flags(&stream->_info);
      if ((uVar4 & 4) != 0) {
        mpt_stream_push(stream,1,(void *)0x0);
      }
      puVar1 = &(con->out).state;
      *puVar1 = *puVar1 & 0xef;
    }
  }
  uVar4 = con->cid;
LAB_0010572b:
  if ((ulong)uVar4 != 0) {
    deregisterCommand(&con->_wait,(ulong)uVar4);
  }
  return sVar6;
}

Assistant:

extern ssize_t mpt_connection_push(MPT_STRUCT(connection) *con, size_t len, const void *src)
{
	MPT_STRUCT(stream) *srm;
	ssize_t ret;
	
	/* determine active backend */
	if (MPT_socket_active(&con->out.sock)) {
		srm = 0;
	}
	else if (!(srm = (void *) con->out.buf._buf)) {
		return MPT_ERROR(BadArgument);
	}
	/* new message start */
	if (!(con->out.state & MPT_OUTFLAG(Active))
	    && con->out._idlen) {
		uint8_t buf[64];
		
		/* create normalized ID */
		if (sizeof(buf) < con->out._idlen) {
			return MPT_ERROR(BadValue);
		}
		if ((ret = mpt_message_id2buf(con->cid, buf, con->out._idlen)) < 0) {
			return ret;
		}
		/* use stream backend */
		if (srm) {
			ret = mpt_stream_push(srm, con->out._idlen, buf);
			if (ret >= 0) {
				/* force atomic id push */
				if (ret < con->out._idlen) {
					mpt_stream_push(srm, 1, 0);
					if (con->cid) {
						deregisterCommand(&con->_wait, con->cid);
					}
					return MPT_ERROR(MissingBuffer);
				} else {
					con->out.state |= MPT_OUTFLAG(Active);
				}
			}
		}
		/* use socket backend (has atomic guarantee for ID setup) */
		else if ((ret = mpt_outdata_push(&con->out, con->out._idlen, buf)) < 0) {
			if (con->cid) {
				deregisterCommand(&con->_wait, con->cid);
			}
			return ret;
		}
	}
	/* regular message payload */
	if (srm) {
		if ((ret = mpt_stream_push(srm, len, src)) < 0) {
			/* push operation failed */
			if (mpt_stream_flags(&srm->_info) & MPT_STREAMFLAG(MesgActive)) {
				mpt_stream_push(srm, 1, 0);
			}
			con->out.state &= ~MPT_OUTFLAG(Active);
		}
		/* message completed */
		else if (!len) {
			con->out.state &= ~MPT_OUTFLAG(Active);
			mpt_stream_flush(srm);
			con->cid = 0;
		} else {
			con->out.state |= MPT_OUTFLAG(Active);
		}
	}
	else if ((ret = mpt_outdata_push(&con->out, len, src)) < 0) {
		if (con->out.state & MPT_OUTFLAG(Active)) {
			mpt_outdata_push(&con->out, 1, 0);
		}
	}
	if (ret < 0 && con->cid) {
		/* clear pending reply */
		deregisterCommand(&con->_wait, con->cid);
	}
	return ret;
}